

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_shl_mod_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b)

{
  TCGv_i64 ret;
  uintptr_t o;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andi_i64_tricore(tcg_ctx,ret,b,0x3f);
  tcg_gen_shl_i64_tricore(tcg_ctx,d,a,ret);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_shl_mod_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i64(tcg_ctx, t, b, 63);
    tcg_gen_shl_i64(tcg_ctx, d, a, t);
    tcg_temp_free_i64(tcg_ctx, t);
}